

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theme.c
# Opt level: O1

theme * theme_create(map *config_map)

{
  natwm_error nVar1;
  theme *theme;
  
  theme = (theme *)malloc(0x20);
  if (theme != (theme *)0x0) {
    nVar1 = border_theme_from_config(config_map,"window.border_width",(border_theme **)theme);
    if ((((nVar1 == NO_ERROR) &&
         (nVar1 = color_theme_from_config(config_map,"window.border_color",&theme->color),
         nVar1 == NO_ERROR)) &&
        (nVar1 = color_value_from_config
                           (config_map,"resize.background_color",&theme->resize_background_color),
        nVar1 == NO_ERROR)) &&
       (nVar1 = color_value_from_config
                          (config_map,"resize.border_color",&theme->resize_border_color),
       nVar1 == NO_ERROR)) {
      return theme;
    }
    theme_destroy(theme);
    internal_logger(natwm_logger,LEVEL_ERROR,"Failed to create theme");
  }
  return (theme *)0x0;
}

Assistant:

struct theme *theme_create(const struct map *config_map)
{
        struct theme *theme = malloc(sizeof(struct theme));

        if (theme == NULL) {
                return NULL;
        }

        enum natwm_error err = GENERIC_ERROR;

        err = border_theme_from_config(
                config_map, WINDOW_BORDER_WIDTH_CONFIG_STRING, &theme->border_width);

        if (err != NO_ERROR) {
                goto handle_error;
        }

        err = color_theme_from_config(config_map, WINDOW_BORDER_COLOR_CONFIG_STRING, &theme->color);

        if (err != NO_ERROR) {
                goto handle_error;
        }

        err = color_value_from_config(
                config_map, RESIZE_BACKGROUND_COLOR_CONFIG_STRING, &theme->resize_background_color);

        if (err != NO_ERROR) {
                goto handle_error;
        }

        err = color_value_from_config(
                config_map, RESIZE_BORDER_COLOR_CONFIG_STRING, &theme->resize_border_color);

        if (err != NO_ERROR) {
                goto handle_error;
        }

        return theme;

handle_error:
        theme_destroy(theme);

        LOG_ERROR(natwm_logger, "Failed to create theme");

        return NULL;
}